

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O2

curi_status
parse_segments(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  ulong uVar1;
  curi_status cVar2;
  curi_status cVar3;
  char *pcVar4;
  curi_status status;
  
  cVar3 = curi_status_success;
  do {
    cVar2 = cVar3;
    uVar1 = *offset;
    pcVar4 = uri + uVar1;
    if (len <= uVar1) {
      pcVar4 = "";
    }
    *offset = uVar1 + 1;
    if (*pcVar4 != '/') break;
    cVar3 = parse_segment(uri,len,offset,settings,userData,0);
  } while (cVar3 != curi_status_error);
  *offset = uVar1;
  return cVar2;
}

Assistant:

static curi_status parse_segments(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // segments  = *( "/" segment )
    curi_status status = curi_status_success;

    for ( ; ; )
    {
        size_t initialOffset = *offset;
        curi_status tryStatus = curi_status_success;

        if (tryStatus == curi_status_success)
            tryStatus = parse_char('/', uri, len, offset, settings, userData);

        if (tryStatus == curi_status_success)
            tryStatus = parse_segment(uri, len, offset, settings, userData, 0);

        if (tryStatus == curi_status_error)
        {
            *offset = initialOffset;
            break;
        }
        else
            status = tryStatus;
    }

    return status;
}